

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void flatbuffers::kotlin::KotlinKMPGenerator::GenerateFun
               (CodeWriter *writer,string *name,string *params,string *returnType,
               function<void_()> *body,bool gen_jvmstatic)

{
  size_type sVar1;
  allocator<char> local_ba;
  allocator<char> local_b9;
  string local_b8;
  function<void_()> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  sVar1 = returnType->_M_string_length;
  local_98 = body;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"name",(allocator<char> *)&local_90);
  CodeWriter::SetValue(writer,&local_b8,name);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"params",(allocator<char> *)&local_90);
  CodeWriter::SetValue(writer,&local_b8,params);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"return_type",&local_b9);
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_ba);
  }
  else {
    std::operator+(&local_90,": ",returnType);
  }
  CodeWriter::SetValue(writer,&local_b8,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  GenerateJvmStaticAnnotation(writer,gen_jvmstatic);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"fun {{name}}({{params}}) {{return_type}} {",
             (allocator<char> *)&local_b8);
  CodeWriter::operator+=(writer,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
  std::function<void_()>::operator()(local_98);
  if (writer->cur_ident_lvl_ != 0) {
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"}",(allocator<char> *)&local_b8);
  CodeWriter::operator+=(writer,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

static void GenerateFun(CodeWriter &writer, const std::string &name,
                          const std::string &params,
                          const std::string &returnType,
                          const std::function<void()> &body,
                          bool gen_jvmstatic = false) {
    // Generates Kotlin function
    // e.g.:
    // fun path(j: Int): Vec3 {
    //     return path(Vec3(), j)
    // }
    auto noreturn = returnType.empty();
    writer.SetValue("name", name);
    writer.SetValue("params", params);
    writer.SetValue("return_type", noreturn ? "" : ": " + returnType);
    GenerateJvmStaticAnnotation(writer, gen_jvmstatic);
    writer += "fun {{name}}({{params}}) {{return_type}} {";
    writer.IncrementIdentLevel();
    body();
    writer.DecrementIdentLevel();
    writer += "}";
  }